

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.h
# Opt level: O0

bool bsplib::read_env<double>(char *str,double *result)

{
  byte bVar1;
  char *__s;
  bool bVar2;
  allocator<char> local_1c9;
  string local_1c8 [32];
  long local_1a8;
  istringstream s;
  char *env;
  double *result_local;
  char *str_local;
  
  __s = getenv(str);
  if (__s != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1c8,__s,&local_1c9);
    std::__cxx11::istringstream::istringstream((istringstream *)&local_1a8,local_1c8,8);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
    std::istream::operator>>((istream *)&local_1a8,result);
    bVar1 = std::ios::operator!((ios *)((long)&local_1a8 + *(long *)(local_1a8 + -0x18)));
    bVar2 = (bVar1 & 1) != 0;
    if (bVar2) {
      str_local._7_1_ = 1;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&local_1a8);
    if (bVar2) goto LAB_001180df;
  }
  str_local._7_1_ = 0;
LAB_001180df:
  return (bool)(str_local._7_1_ & 1);
}

Assistant:

bool read_env( const char * str, T & result ) {
#if HAS_DUPENV_S_WIN32
        char * env = NULL;
        if (_dupenv_s( &env, NULL , str) )
            return false;
#else
        const char * env = std::getenv( str );
#endif
        if (env) {
            std::istringstream s( env );
#if HAS_DUPENV_S_WIN32
            free(env);
#endif
            s >> result;
            if (!s)
                return true;
        }
        return false;
    }